

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-trace.cpp
# Opt level: O0

void __thiscall testDebugTrace::test_method(testDebugTrace *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  string *psVar4;
  long lVar5;
  istream *piVar6;
  CustomEntity *local_768;
  basic_cstring<const_char> local_718;
  basic_cstring<const_char> local_708;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_6f8;
  assertion_result local_6d8;
  basic_cstring<const_char> local_6c0;
  basic_cstring<const_char> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  byte local_67a;
  allocator<char> local_679;
  undefined1 local_678 [6];
  bool two_sub_string_identical;
  string str_to_test;
  string asubstr2;
  string asubstr;
  size_t found;
  ostringstream oss_debug_file;
  string local_498 [8];
  string astr;
  fstream the_debug_file;
  basic_cstring<const_char> local_268;
  output_test_stream local_258 [8];
  output_test_stream output;
  CustomEntity *entity;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [32];
  CustomEntity *local_80;
  CustomEntity *ptr_entity;
  basic_cstring<const_char> local_68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_58;
  basic_cstring<const_char> local_30;
  basic_cstring<const_char> local_20;
  testDebugTrace *local_10;
  testDebugTrace *this_local;
  
  local_10 = this;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_20,0x3c,&local_30);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_58,plVar3,(char (*) [1])0x11602b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
               ,0x66);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (&local_58,&local_68,0x3c,1,2,dynamicgraph::CustomEntity::CLASS_NAME_abi_cxx11_,
               "dynamicgraph::CustomEntity::CLASS_NAME","CustomEntity","\"CustomEntity\"");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  psVar4 = (string *)dynamicgraph::FactoryStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"CustomEntity",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"my-entity",(allocator<char> *)((long)&entity + 7));
  lVar5 = dynamicgraph::FactoryStorage::newEntity(psVar4,local_a0);
  if (lVar5 == 0) {
    local_768 = (CustomEntity *)0x0;
  }
  else {
    local_768 = (CustomEntity *)
                __dynamic_cast(lVar5,&dynamicgraph::Entity::typeinfo,
                               &dynamicgraph::CustomEntity::typeinfo,0);
  }
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&entity + 7));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = local_768;
  dynamicgraph::CustomEntity::testDebugTrace(local_768);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_268);
  boost::test_tools::output_test_stream::output_test_stream(local_258,&local_268,1);
  std::fstream::fstream((void *)((long)&astr.field_2 + 8));
  std::fstream::open(astr.field_2._M_local_buf + 8,
                     (_Ios_Openmode)dynamicgraph::DebugTrace::DEBUG_FILENAME_DEFAULT);
  std::__cxx11::string::string(local_498);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&found);
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(astr.field_2._M_local_buf + 8),local_498);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::string::find((char *)local_498,0x1161af);
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)((long)&asubstr2.field_2 + 8),(ulong)local_498);
    std::__cxx11::string::find(asubstr2.field_2._M_local_buf + 8,0x1161af);
    std::__cxx11::string::length();
    std::__cxx11::string::substr
              ((ulong)((long)&str_to_test.field_2 + 8),(ulong)(asubstr2.field_2._M_local_buf + 8));
    std::operator<<((ostream *)&found,(string *)(str_to_test.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(str_to_test.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(asubstr2.field_2._M_local_buf + 8));
  }
  std::fstream::close();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_678,"# In {# In/Out { }Here is a test# Out }",&local_679);
  std::allocator<char>::~allocator(&local_679);
  std::__cxx11::ostringstream::str();
  local_67a = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_678,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
               ,0x66);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6b0,0x65,&local_6c0);
    boost::test_tools::assertion_result::assertion_result(&local_6d8,(bool)(local_67a & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_708,"two_sub_string_identical",0x18);
    boost::unit_test::operator<<(&local_6f8,plVar3,&local_708);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_718,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/debug-trace.cpp"
               ,0x66);
    boost::test_tools::tt_detail::report_assertion(&local_6d8,&local_6f8,&local_718,0x65,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_6f8);
    boost::test_tools::assertion_result::~assertion_result(&local_6d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (local_80 != (CustomEntity *)0x0) {
    (**(code **)(*(long *)local_80 + 8))();
  }
  std::__cxx11::string::~string((string *)local_678);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&found);
  std::__cxx11::string::~string(local_498);
  std::fstream::~fstream((void *)((long)&astr.field_2 + 8));
  boost::test_tools::output_test_stream::~output_test_stream(local_258);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testDebugTrace) {
  BOOST_CHECK_EQUAL(dynamicgraph::CustomEntity::CLASS_NAME, "CustomEntity");

  dynamicgraph::CustomEntity *ptr_entity =
      (dynamic_cast<dynamicgraph::CustomEntity *>(
          dynamicgraph::FactoryStorage::getInstance()->newEntity("CustomEntity",

                                                                 "my-entity")));

  dynamicgraph::CustomEntity &entity = *ptr_entity;
  entity.testDebugTrace();

  /// Copy the debug file into the oss_debug_file
  output_test_stream output;
  std::fstream the_debug_file;
  the_debug_file.open(dynamicgraph::DebugTrace::DEBUG_FILENAME_DEFAULT,
                      std::ios::in);

  // Extract the filename and this source file from the output
  std::string astr;
  std::ostringstream oss_debug_file;
  while (std::getline(the_debug_file, astr)) {
    std::size_t found = astr.find(":");
    std::string asubstr = astr.substr(found + 1, astr.length());
    found = asubstr.find(":");
    std::string asubstr2 = asubstr.substr(found + 1, astr.length());
    oss_debug_file << asubstr2;
  }

  the_debug_file.close();

  // Compare with the strings put inside this source file
  std::string str_to_test =
      "# In {"
      "# In/Out { }"
      "Here is a test"
      "# Out }";
  bool two_sub_string_identical;

  // Make comparisons.
  two_sub_string_identical = str_to_test == oss_debug_file.str();

  BOOST_CHECK(two_sub_string_identical);

  delete ptr_entity;
}